

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,string *delim)

{
  string *psVar1;
  ostream *poVar2;
  string *psVar3;
  ostringstream s;
  ostringstream aoStack_1a8 [376];
  
  ::std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  psVar3 = *(string **)this;
  psVar1 = *(string **)(this + 8);
  if (psVar3 != psVar1) {
    ::std::operator<<((ostream *)aoStack_1a8,psVar3);
    psVar3 = psVar3 + 0x20;
  }
  for (; psVar3 != psVar1; psVar3 = psVar3 + 0x20) {
    poVar2 = ::std::operator<<((ostream *)aoStack_1a8,(string *)v);
    ::std::operator<<(poVar2,psVar3);
  }
  ::std::__cxx11::stringbuf::str();
  if (((__return_storage_ptr__->_M_string_length != 0) &&
      ((v->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish == (pointer)0x1)) &&
     ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
      *(char *)&(((v->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p)) {
    ::std::__cxx11::string::pop_back();
  }
  ::std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string join(const T &v, std::string delim = ",") {
    std::ostringstream s;
    auto beg = std::begin(v);
    auto end = std::end(v);
    if(beg != end)
        s << *beg++;
    while(beg != end) {
        s << delim << *beg++;
    }
    auto rval = s.str();
    if(!rval.empty() && delim.size() == 1 && rval.back() == delim[0]) {
        // remove trailing delimiter if the last entry was empty
        rval.pop_back();
    }
    return rval;
}